

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  GLFWbool GVar1;
  _GLFWcursor *cursor;
  _GLFWcursor *p_Stack_10;
  int shape_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    p_Stack_10 = (_GLFWcursor *)0x0;
  }
  else if ((((((shape == 0x36001) || (shape == 0x36002)) || (shape == 0x36003)) ||
            ((shape == 0x36004 || (shape == 0x36005)))) ||
           ((shape == 0x36006 || ((shape == 0x36007 || (shape == 0x36008)))))) ||
          ((shape == 0x36009 || (shape == 0x3600a)))) {
    p_Stack_10 = (_GLFWcursor *)_glfw_calloc(1,0x10);
    p_Stack_10->next = _glfw.cursorListHead;
    _glfw.cursorListHead = p_Stack_10;
    GVar1 = (*_glfw.platform.createStandardCursor)(p_Stack_10,shape);
    if (GVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)p_Stack_10);
      p_Stack_10 = (_GLFWcursor *)0x0;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid standard cursor 0x%08X",(ulong)(uint)shape);
    p_Stack_10 = (_GLFWcursor *)0x0;
  }
  return (GLFWcursor *)p_Stack_10;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (shape != GLFW_ARROW_CURSOR &&
        shape != GLFW_IBEAM_CURSOR &&
        shape != GLFW_CROSSHAIR_CURSOR &&
        shape != GLFW_POINTING_HAND_CURSOR &&
        shape != GLFW_RESIZE_EW_CURSOR &&
        shape != GLFW_RESIZE_NS_CURSOR &&
        shape != GLFW_RESIZE_NWSE_CURSOR &&
        shape != GLFW_RESIZE_NESW_CURSOR &&
        shape != GLFW_RESIZE_ALL_CURSOR &&
        shape != GLFW_NOT_ALLOWED_CURSOR)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid standard cursor 0x%08X", shape);
        return NULL;
    }

    cursor = _glfw_calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfw.platform.createStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}